

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::TexCubeCompletenessCase::iterate(TexCubeCompletenessCase *this)

{
  TestLog *log;
  RenderContext *context;
  bool bVar1;
  int iVar2;
  deUint32 seed;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Surface *result;
  char *description;
  byte bVar4;
  int width;
  undefined8 uVar5;
  RGBA in_R9D;
  int height;
  int face;
  CubeFace face_00;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Random random;
  TextureRenderer renderer;
  Surface local_58;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  width = *(int *)CONCAT44(extraout_var,iVar2);
  if (0x3f < *(int *)CONCAT44(extraout_var,iVar2)) {
    width = 0x40;
  }
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 4);
  height = 0x40;
  if (iVar2 < 0x40) {
    height = iVar2;
  }
  log = this->m_testCtx->m_log;
  uVar5 = 1;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&renderer,this->m_renderCtx,log,GLSL_VERSION_100_ES,PRECISION_MEDIUMP);
  tcu::Surface::Surface(&renderedFrame,width,height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  seed = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&random.m_rnd,seed);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)CONCAT44(extraout_var_01,iVar2) + -0x40;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  iVar2 = de::Random::getInt(&random,0,iVar2);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_02,iVar3) + 4) + -0x40;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar3 = de::Random::getInt(&random,0,iVar3);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this);
  bVar4 = 1;
  for (face_00 = CUBEFACE_NEGATIVE_X; face_00 != CUBEFACE_LAST;
      face_00 = face_00 + CUBEFACE_POSITIVE_X) {
    glu::TextureTestUtil::computeQuadTexCoordCube(&texCoord,face_00);
    glwViewport(iVar2,iVar3,width,height);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,TEXTURETYPE_CUBE);
    context = this->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_58,&renderedFrame);
    result = &local_58;
    glu::readPixels(context,iVar2,iVar3,(PixelBufferAccess *)&local_58);
    bVar1 = compareToConstantColor
                      (log,(char *)&renderedFrame,(char *)(ulong)(this->m_compareColor).m_value,
                       result,(CompareLogMode)uVar5,in_R9D);
    bVar4 = bVar4 & bVar1;
  }
  description = "Image comparison failed";
  if (bVar4 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this->m_testCtx,(byte)~bVar4 & QP_TEST_RESULT_FAIL,description);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Surface::~Surface(&renderedFrame);
  deqp::gls::TextureTestUtil::TextureRenderer::~TextureRenderer(&renderer);
  return STOP;
}

Assistant:

TexCubeCompletenessCase::IterateResult TexCubeCompletenessCase::iterate (void)
{
	int					viewportWidth	= de::min(64, m_renderCtx.getRenderTarget().getWidth());
	int					viewportHeight	= de::min(64, m_renderCtx.getRenderTarget().getHeight());
	bool				allFacesOk		= true;
	TestLog&			log				= m_testCtx.getLog();
	TextureRenderer		renderer		(m_renderCtx, log, glu::GLSL_VERSION_100_ES, glu::PRECISION_MEDIUMP);
	tcu::Surface		renderedFrame	(viewportWidth, viewportHeight);
	vector<float>		texCoord;

	de::Random			random			(deStringHash(getName()));
	int					offsetX			= random.getInt(0, de::max(0,m_renderCtx.getRenderTarget().getWidth()	- 64));
	int					offsetY			= random.getInt(0, de::max(0,m_renderCtx.getRenderTarget().getHeight()	- 64));

	createTexture();

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		computeQuadTexCoordCube	(texCoord, (tcu::CubeFace)face);

		glViewport				(offsetX, offsetY, viewportWidth, viewportHeight);

		renderer.renderQuad		(0, &texCoord[0], glu::TextureTestUtil::TEXTURETYPE_CUBE);
		glu::readPixels			(m_renderCtx, offsetX, offsetY, renderedFrame.getAccess());

		bool isOk = compareToConstantColor(log, "Result", "Image comparison result", renderedFrame, tcu::COMPARE_LOG_RESULT, m_compareColor);

		if (!isOk)
			allFacesOk = false;
	}

	m_testCtx.setTestResult(allFacesOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							allFacesOk ? "Pass"					: "Image comparison failed");
	return STOP;
}